

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O1

LArYieldResult * __thiscall
NEST::LArNEST::LegacyGetYields
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,double energy,double efield,
          double yieldFactor,double excitationRatio,double epsilon,double recombProb)

{
  RandomGen *pRVar1;
  int64_t iVar2;
  uint uVar3;
  ulong N0;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar4 = energy * 51282.05128205128 * 0.107;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  pRVar1 = RandomGen::rndm();
  dVar5 = RandomGen::rand_gauss(pRVar1,yieldFactor,yieldFactor * 0.25,true);
  pRVar1 = RandomGen::rndm();
  dVar4 = RandomGen::rand_gauss(pRVar1,energy * 51282.05128205128,dVar4,true);
  dVar4 = floor(dVar4 + 0.5);
  uVar3 = (uint)dVar4;
  if (yieldFactor < 1.0) {
    dVar4 = 1.0;
    if (dVar5 <= 1.0) {
      dVar4 = dVar5;
    }
    pRVar1 = RandomGen::rndm();
    iVar2 = RandomGen::binom_draw(pRVar1,(long)(int)uVar3,dVar4);
    uVar3 = (uint)iVar2;
  }
  N0 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    N0 = 0;
  }
  if (energy < 1.95e-05) {
    N0 = 0;
  }
  pRVar1 = RandomGen::rndm();
  iVar2 = RandomGen::binom_draw(pRVar1,N0,excitationRatio / (excitationRatio + 1.0));
  dVar4 = (double)iVar2;
  dVar6 = (double)(int)N0 - dVar4;
  pRVar1 = RandomGen::rndm();
  iVar2 = RandomGen::binom_draw(pRVar1,(long)dVar6,recombProb);
  dVar5 = (double)iVar2 + dVar4;
  dVar7 = (double)(int)N0 - dVar5;
  __return_storage_ptr__->TotalYield = (dVar5 + dVar7) / energy;
  __return_storage_ptr__->QuantaYield = dVar7 / energy;
  __return_storage_ptr__->LightYield = dVar5 / energy;
  __return_storage_ptr__->Nph = dVar5;
  __return_storage_ptr__->Ne = dVar7;
  __return_storage_ptr__->Nex = dVar4;
  __return_storage_ptr__->Nion = dVar6;
  __return_storage_ptr__->Lindhard = 0.0;
  __return_storage_ptr__->ElectricField = efield;
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::LegacyGetYields(double energy, double efield,
                                        double yieldFactor,
                                        double excitationRatio, double epsilon,
                                        double recombProb) {
  // determine ultimate number of quanta from current E-deposition (ph+e-)
  // total mean number of exc/ions the total number of either quanta produced
  // is equal to product of the work function, the energy deposited,
  // and yield reduction, for NR
  double MeanNq = legacy_scint_yield * energy;
  double sigma = sqrt(legacy_resolution_scale * MeanNq);  // Fano
  double leftvar =
      RandomGen::rndm()->rand_gauss(yieldFactor, 0.25 * yieldFactor, true);
  if (leftvar > 1.0) {
    leftvar = 1.0;
  }
  int Nq = int(floor(RandomGen::rndm()->rand_gauss(MeanNq, sigma, true) + 0.5));
  if (yieldFactor < 1) {
    Nq = RandomGen::rndm()->binom_draw(Nq, leftvar);
  }

  // if Edep below work function, can't make any quanta, and if Nq
  // less than zero because Gaussian fluctuated low, update to zero
  if (energy < 1 / legacy_scint_yield || Nq < 0) {
    Nq = 0;
  }

  // next section binomially assigns quanta to excitons and ions
  double Nex = RandomGen::rndm()->binom_draw(
      Nq, excitationRatio / (1 + excitationRatio));
  double Nion = Nq - Nex;

  // use binomial distribution to assign photons, electrons, where photons
  // are excitons plus recombined ionization electrons, while final
  // collected electrons are the "escape" (non-recombined) electrons
  double Nph = Nex + RandomGen::rndm()->binom_draw(Nion, recombProb);
  double Ne = Nq - Nph;

  // create the quanta results
  LArYieldResult result{(Ne + Nph) / energy,
                        Ne / energy,
                        Nph / energy,
                        Nph,
                        Ne,
                        Nex,
                        Nion,
                        0.0,
                        efield};
  return result;
}